

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_7::TwoLevelIterator::SetDataIterator
          (TwoLevelIterator *this,Iterator *data_iter)

{
  Iterator *pIVar1;
  undefined1 local_20 [16];
  Iterator *data_iter_local;
  TwoLevelIterator *this_local;
  
  local_20._8_8_ = data_iter;
  data_iter_local = &this->super_Iterator;
  pIVar1 = IteratorWrapper::iter(&this->data_iter_);
  if (pIVar1 != (Iterator *)0x0) {
    IteratorWrapper::status((IteratorWrapper *)local_20);
    SaveError(this,(Status *)local_20);
    Status::~Status((Status *)local_20);
  }
  IteratorWrapper::Set(&this->data_iter_,(Iterator *)local_20._8_8_);
  return;
}

Assistant:

void TwoLevelIterator::SetDataIterator(Iterator* data_iter) {
  if (data_iter_.iter() != nullptr) SaveError(data_iter_.status());
  data_iter_.Set(data_iter);
}